

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

void __thiscall CBinds::GetKeyID(CBinds *this,char *pBindStr,int *KeyID,int *Modifier)

{
  int iVar1;
  char *pcVar2;
  int *in_RCX;
  int *in_RDX;
  char *in_RSI;
  CBinds *in_RDI;
  char *pBind;
  int LocalModifier;
  int LocalKeyID;
  int local_28;
  int local_24;
  
  *in_RDX = 0x1da;
  *in_RCX = 4;
  local_24 = 0;
  do {
    if (0x1d9 < local_24) {
      return;
    }
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      pcVar2 = Get(in_RDI,local_24,local_28);
      if (*pcVar2 != '\0') {
        iVar1 = str_comp(pcVar2,(char *)in_RDI);
        if (iVar1 == 0) {
          *in_RDX = local_24;
          *in_RCX = local_28;
          return;
        }
        pcVar2 = str_find(pcVar2,in_RSI);
        if (pcVar2 != (char *)0x0) {
          *in_RDX = local_24;
          *in_RCX = local_28;
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void CBinds::GetKeyID(const char *pBindStr, int& KeyID, int& Modifier)
{
	KeyID = KEY_LAST;
	Modifier = MODIFIER_COUNT;

	for(int LocalKeyID = 0; LocalKeyID < KEY_LAST; LocalKeyID++)
	{
		for(int LocalModifier = 0; LocalModifier < MODIFIER_COUNT; LocalModifier++)
		{
			const char *pBind = Get(LocalKeyID, LocalModifier);
			if(!pBind[0])
				continue;

			if(str_comp(pBind, pBindStr) == 0)
			{
				KeyID = LocalKeyID;
				Modifier = LocalModifier;
				return;
			}
			if(str_find(pBind, pBindStr) != 0)
			{
				KeyID = LocalKeyID;
				Modifier = LocalModifier;
			}
		}
	}
}